

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall
Variable_setInterfaceTypeNoneByEnum_Test::TestBody(Variable_setInterfaceTypeNoneByEnum_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  string a;
  ComponentPtr c;
  AssertionResult gtest_ar;
  ModelPtr m;
  VariablePtr v;
  string e;
  PrinterPtr printer;
  long *local_d0;
  AssertHelper local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  shared_ptr *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  long local_90 [2];
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  InterfaceType local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  bool local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component>\n    <variable interface=\"none\"/>\n  </component>\n</model>\n"
             ,"");
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  pcVar3 = "";
  local_a0 = (shared_ptr *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"","");
  createModelWithComponent(local_70,(string *)&local_c0);
  if (local_a0 != (shared_ptr *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  libcellml::ComponentEntity::component((ulong)&local_a0);
  libcellml::Variable::create();
  libcellml::Variable::setInterfaceType(local_60);
  libcellml::Component::addVariable(local_a0);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_c0,local_30);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_80,"e","a",&local_50,&local_c0);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x13a,pcVar3);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if (local_d0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_d0 != (long *)0x0)) {
        (**(code **)(*local_d0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(Variable, setInitialValueByDouble)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable initial_value=\"0\"/>\n"
        "  </component>\n"
        "</model>\n";
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v = libcellml::Variable::create();
    double value = 0.0;
    v->setInitialValue(value);
    c->addVariable(v);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}